

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Link.cpp
# Opt level: O1

TShHandleBase * ConstructLinker(EShExecutable executable,int param_2)

{
  TLinker *this;
  
  this = (TLinker *)operator_new(0xa8);
  (this->super_TShHandleBase)._vptr_TShHandleBase = (_func_int **)&PTR__TGenericLinker_0093fe20;
  TLinker::TLinker(this,executable,(TInfoSink *)(this + 1));
  (this->super_TShHandleBase)._vptr_TShHandleBase = (_func_int **)&PTR__TGenericLinker_0093fe20;
  this[1].super_TShHandleBase._vptr_TShHandleBase = (_func_int **)&this[1].infoSink;
  this[1].super_TShHandleBase.pool = (TPoolAllocator *)0x0;
  *(undefined1 *)&this[1].infoSink = 0;
  *(undefined4 *)&this[1].appAttributeBindings = 4;
  this[1].fixedAttributeBindings = (ShBindingTable *)0x0;
  this[1].excludedAttributes = (int *)&this[1].uniformBindings;
  *(undefined8 *)&this[1].excludedCount = 0;
  *(undefined1 *)&this[1].uniformBindings = 0;
  *(undefined4 *)&this[2].super_TShHandleBase.pool = 4;
  this[2].infoSink = (TInfoSink *)0x0;
  return &this->super_TShHandleBase;
}

Assistant:

TShHandleBase* ConstructLinker(EShExecutable executable, int) { return new TGenericLinker(executable); }